

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frameutils.cpp
# Opt level: O0

string * compute_crc(string *msg)

{
  ulong uVar1;
  long lVar2;
  char *pcVar3;
  iterator it2;
  char *in_RSI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  iterator local_80;
  int local_74;
  undefined4 local_70;
  int i;
  int len;
  allocator local_59;
  string local_58 [8];
  string crc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [8];
  string m;
  string *msg_local;
  
  std::operator+(local_38,in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"10000000000000101",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_70 = std::__cxx11::string::length();
  for (local_74 = 0; uVar1 = (ulong)local_74, lVar2 = std::__cxx11::string::length(),
      uVar1 < lVar2 - 0x10U; local_74 = local_74 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if (*pcVar3 != '0') {
      local_88._M_current = (char *)std::__cxx11::string::begin();
      local_80._M_current =
           (char *)__gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+(&local_88,(long)local_74);
      it2._M_current = (char *)std::__cxx11::string::begin();
      string_xor(local_80,it2,0x11);
    }
  }
  std::__cxx11::string::substr((ulong)msg,(ulong)local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)local_38);
  return msg;
}

Assistant:

string compute_crc(string msg) {
//	string m = msg + "000";
//	string crc = "1011";
	string m = msg + "0000000000000000";
	string crc = "10000000000000101";
	int len = m.length();

	for (int i = 0; i < m.length() - 16; ++i) {
		if(m[i] == '0') continue;
		/* cout << m << endl; */
		string_xor(m.begin() + i, crc.begin(), 17);
	}
	/* cout << "final\n"; */
//	cout <<  m << endl;
	return m.substr(len - 16, 16);
}